

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ColorConvertRGBtoHSV(float r,float g,float b,float *out_h,float *out_s,float *out_v)

{
  float fVar1;
  float local_40;
  float local_34;
  float chroma;
  float K;
  float *out_v_local;
  float *out_s_local;
  float *out_h_local;
  float local_10;
  float b_local;
  float g_local;
  float r_local;
  
  local_34 = 0.0;
  out_h_local._4_4_ = b;
  local_10 = g;
  b_local = r;
  if (g < b) {
    ImSwap<float>(&local_10,(float *)((long)&out_h_local + 4));
    local_34 = -1.0;
  }
  if (b_local < local_10) {
    ImSwap<float>(&b_local,&local_10);
    local_34 = -0.33333334 - local_34;
  }
  if (out_h_local._4_4_ <= local_10) {
    local_40 = out_h_local._4_4_;
  }
  else {
    local_40 = local_10;
  }
  local_40 = b_local - local_40;
  fVar1 = ImFabs(local_34 + (local_10 - out_h_local._4_4_) / (local_40 * 6.0 + 1e-20));
  *out_h = fVar1;
  *out_s = local_40 / (b_local + 1e-20);
  *out_v = b_local;
  return;
}

Assistant:

void ImGui::ColorConvertRGBtoHSV(float r, float g, float b, float& out_h, float& out_s, float& out_v)
{
    float K = 0.f;
    if (g < b)
    {
        ImSwap(g, b);
        K = -1.f;
    }
    if (r < g)
    {
        ImSwap(r, g);
        K = -2.f / 6.f - K;
    }

    const float chroma = r - (g < b ? g : b);
    out_h = ImFabs(K + (g - b) / (6.f * chroma + 1e-20f));
    out_s = chroma / (r + 1e-20f);
    out_v = r;
}